

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  ulong *puVar1;
  short sVar2;
  char cVar3;
  BYTE *d;
  long *plVar4;
  char *pcVar5;
  long lVar6;
  short *psVar7;
  char *pcVar8;
  uint uVar9;
  int *piVar10;
  ulong uVar11;
  int *piVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  BYTE *e_1;
  long *plVar18;
  int iVar19;
  ulong *puVar20;
  ulong *puVar21;
  long lVar22;
  long *plVar23;
  long lVar24;
  ulong uVar25;
  BYTE *e;
  short *psVar26;
  BYTE *e_3;
  short *psVar27;
  long *plVar28;
  int *piVar29;
  char *pcVar30;
  char cVar31;
  int iVar32;
  U16 *hashTable;
  short *local_78;
  char *local_70;
  
  iVar32 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
  }
  else {
    state = (void *)0x0;
  }
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar32 = inputSize + (uint)inputSize / 0xff + 0x10;
  }
  iVar16 = (int)dest;
  if (maxOutputSize < iVar32) {
    if (inputSize < 0x1000b) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize != 0) {
        uVar13 = *(uint *)((long)state + 0x4000);
        pcVar8 = dest + maxOutputSize;
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4000) = uVar13 + inputSize;
        *(undefined4 *)((long)state + 0x4004) = 3;
        piVar29 = (int *)source;
        if ((uint)inputSize < 0xd) {
LAB_001bd95f:
          pcVar30 = source + ((ulong)(uint)inputSize - (long)piVar29);
          if (pcVar8 < (char *)((long)dest + (long)(pcVar30 + (ulong)(pcVar30 + 0xf0) / 0xff + 1)))
          {
            return 0;
          }
          if (pcVar30 < (char *)0xf) {
            *dest = (char)pcVar30 << 4;
          }
          else {
            *dest = -0x10;
            for (pcVar8 = pcVar30 + -0xf; dest = (char *)((long)dest + 1), (char *)0xfe < pcVar8;
                pcVar8 = pcVar8 + -0xff) {
              *dest = -1;
            }
            *dest = (char)pcVar8;
          }
          memcpy((char *)((long)dest + 1),piVar29,(size_t)pcVar30);
          return ((int)(char *)((long)dest + 1) + (int)pcVar30) - iVar16;
        }
        lVar24 = (long)source - (ulong)uVar13;
        *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar13;
        local_78 = (short *)dest;
LAB_001bd328:
        uVar11 = 1;
        iVar32 = *(int *)((long)piVar29 + 1);
        piVar10 = (int *)((long)piVar29 + 1);
        uVar13 = acceleration << 6;
        do {
          piVar12 = piVar10;
          piVar10 = (int *)(uVar11 + (long)piVar12);
          dest = (char *)local_78;
          if (source + ((ulong)(uint)inputSize - 0xb) < piVar10) goto LAB_001bd95f;
          uVar11 = (ulong)(uVar13 >> 6);
          uVar13 = uVar13 + 1;
          uVar17 = (ulong)((uint)(iVar32 * -0x61c8864f) >> 0x13);
          uVar25 = (ulong)*(ushort *)((long)state + uVar17 * 2);
          sVar2 = (short)lVar24;
          iVar32 = *piVar10;
          *(short *)((long)state + uVar17 * 2) = (short)piVar12 - sVar2;
        } while (*(int *)(lVar24 + uVar25) != *piVar12);
        lVar6 = uVar25 + lVar24;
        lVar22 = 0;
        cVar3 = (char)piVar12 * '\x10' + (char)piVar29 * -0x10;
        do {
          cVar31 = cVar3;
          lVar15 = lVar22;
          pcVar30 = (char *)(lVar6 + lVar15);
          piVar10 = (int *)((long)piVar12 + lVar15);
          if ((pcVar30 <= source) || (piVar10 <= piVar29)) break;
          lVar22 = lVar15 + -1;
          cVar3 = cVar31 + -0x10;
        } while (*(char *)((long)piVar12 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
        uVar13 = (int)piVar12 - (int)piVar29;
        uVar25 = (ulong)(uVar13 + (int)lVar15);
        uVar11 = (ulong)uVar13 + lVar15;
        if (pcVar8 < (char *)((long)local_78 + (uVar11 & 0xffffffff) / 0xff + uVar25 + 9)) {
          return 0;
        }
        if ((uint)uVar11 < 0xf) {
          psVar7 = (short *)((long)local_78 + 1);
          *(char *)local_78 = cVar31;
        }
        else {
          *(char *)local_78 = -0x10;
          psVar7 = local_78 + 1;
          for (iVar32 = ((int)piVar12 - (int)piVar29) + (int)lVar15 + -0xf; 0xfe < iVar32;
              iVar32 = iVar32 + -0xff) {
            *(char *)((long)psVar7 + -1) = -1;
            psVar7 = (short *)((long)psVar7 + 1);
          }
          *(char *)((long)psVar7 + -1) = (char)iVar32;
        }
        psVar26 = (short *)(uVar25 + (long)psVar7);
        do {
          *(undefined8 *)psVar7 = *(undefined8 *)piVar29;
          psVar7 = psVar7 + 4;
          piVar29 = piVar29 + 2;
        } while (psVar7 < psVar26);
        do {
          *psVar26 = (short)piVar10 - (short)pcVar30;
          puVar1 = (ulong *)(piVar10 + 1);
          puVar21 = (ulong *)(pcVar30 + 4);
          puVar20 = puVar1;
          if (source + ((ulong)(uint)inputSize - 0xc) <= puVar1) {
LAB_001bd4d2:
            iVar32 = ((int)puVar20 - (int)piVar10) + -4;
LAB_001bd4da:
            if (puVar20 < source + ((ulong)(uint)inputSize - 0xc)) {
              if (*puVar21 == *puVar20) goto code_r0x001bd4ee;
              uVar25 = *puVar20 ^ *puVar21;
              uVar11 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar13 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar32;
            }
            else {
              if ((puVar20 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar21 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar21 = (ulong *)((long)puVar21 + 4);
              }
              if ((puVar20 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar21 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar21 = (ulong *)((long)puVar21 + 2);
              }
              if (puVar20 < source + ((ulong)(uint)inputSize - 5)) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar21 == (char)*puVar20));
              }
              uVar13 = (int)puVar20 - (int)puVar1;
            }
            goto LAB_001bd513;
          }
          if (*puVar21 == *puVar1) {
            puVar21 = (ulong *)(pcVar30 + 0xc);
            puVar20 = (ulong *)(piVar10 + 3);
            goto LAB_001bd4d2;
          }
          uVar11 = *puVar1 ^ *puVar21;
          lVar22 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          uVar13 = (uint)lVar22 >> 3;
LAB_001bd513:
          if (pcVar8 < (char *)((long)psVar26 + (ulong)(uVar13 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          dest = (char *)(psVar26 + 1);
          if (uVar13 < 0xf) {
            *(char *)local_78 = (char)*local_78 + (char)uVar13;
          }
          else {
            *(char *)local_78 = (char)*local_78 + '\x0f';
            *(short *)((long)dest + 0) = -1;
            *(short *)((long)dest + 2) = -1;
            lVar22 = 0;
            for (uVar9 = uVar13 - 0xf; 0x3fb < uVar9; uVar9 = uVar9 - 0x3fc) {
              pcVar30 = (char *)((long)psVar26 + lVar22 + 6);
              pcVar30[0] = -1;
              pcVar30[1] = -1;
              pcVar30[2] = -1;
              pcVar30[3] = -1;
              lVar22 = lVar22 + 4;
            }
            lVar6 = lVar22 + ((ulong)uVar9 & 0xffff) / 0xff;
            dest = (char *)((long)psVar26 + lVar6 + 3);
            *(char *)((long)psVar26 + lVar6 + 2) =
                 (char)lVar22 + (char)((uVar9 & 0xffff) / 0xff) + (char)uVar13 + -0xf;
          }
          lVar22 = (long)piVar10 + (ulong)uVar13;
          piVar29 = (int *)(lVar22 + 4);
          if (source + ((ulong)(uint)inputSize - 0xb) <= piVar29) goto LAB_001bd95f;
          *(short *)((long)state + (ulong)((uint)(*(int *)(lVar22 + 2) * -0x61c8864f) >> 0x13) * 2)
               = ((short)lVar22 + 2) - sVar2;
          uVar11 = (ulong)((uint)(*piVar29 * -0x61c8864f) >> 0x13);
          uVar25 = (ulong)*(ushort *)((long)state + uVar11 * 2);
          pcVar30 = (char *)(lVar24 + uVar25);
          *(short *)((long)state + uVar11 * 2) = (short)piVar29 - sVar2;
          local_78 = (short *)dest;
          if (*(int *)(lVar24 + uVar25) != *piVar29) goto LAB_001bd328;
          psVar26 = (short *)((long)dest + 1);
          *dest = '\0';
          piVar10 = piVar29;
        } while( true );
      }
      if (maxOutputSize < 1) {
        return 0;
      }
LAB_001bd2b6:
      *dest = '\0';
      return 1;
    }
    if ((uint)inputSize < 0x7e000001) {
      uVar13 = *(uint *)((long)state + 0x4000);
      lVar24 = (long)source - (ulong)uVar13;
      pcVar8 = dest + maxOutputSize;
      *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
      *(uint *)((long)state + 0x4000) = inputSize + uVar13;
      *(undefined4 *)((long)state + 0x4004) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar13
      ;
      plVar28 = (long *)source;
      local_70 = dest;
LAB_001bcb57:
      uVar11 = 1;
      lVar22 = *(long *)((long)plVar28 + 1);
      plVar4 = (long *)((long)plVar28 + 1);
      uVar13 = acceleration << 6;
      while( true ) {
        plVar23 = (long *)(uVar11 + (long)plVar4);
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar23) goto LAB_001bd219;
        uVar11 = (ulong)(lVar22 * -0x30e4432345000000) >> 0x34;
        uVar9 = *(uint *)((long)state + uVar11 * 4);
        iVar32 = (int)plVar4;
        iVar14 = (int)lVar24;
        lVar22 = *plVar23;
        *(int *)((long)state + uVar11 * 4) = iVar32 - iVar14;
        if (((uint)(iVar32 - iVar14) <= uVar9 + 0xffff) &&
           (*(int *)(lVar24 + (ulong)uVar9) == (int)*plVar4)) break;
        uVar11 = (ulong)(uVar13 >> 6);
        uVar13 = uVar13 + 1;
        plVar4 = plVar23;
      }
      lVar6 = (ulong)uVar9 + lVar24;
      lVar22 = 0;
      cVar3 = (char)plVar4 * '\x10' + (char)plVar28 * -0x10;
      do {
        cVar31 = cVar3;
        lVar15 = lVar22;
        piVar29 = (int *)(lVar6 + lVar15);
        plVar23 = (long *)((long)plVar4 + lVar15);
        if ((piVar29 <= source) || (plVar23 <= plVar28)) break;
        lVar22 = lVar15 + -1;
        cVar3 = cVar31 + -0x10;
      } while (*(char *)((long)plVar4 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
      uVar13 = iVar32 - (int)plVar28;
      uVar11 = (ulong)(uVar13 + (int)lVar15);
      uVar25 = (ulong)uVar13 + lVar15;
      if (pcVar8 < local_70 + (uVar25 & 0xffffffff) / 0xff + uVar11 + 9) {
        return 0;
      }
      if ((uint)uVar25 < 0xf) {
        plVar4 = (long *)(local_70 + 1);
        *local_70 = cVar31;
      }
      else {
        *local_70 = -0x10;
        plVar4 = (long *)(local_70 + 2);
        for (iVar32 = (iVar32 - (int)plVar28) + (int)lVar15 + -0xf; 0xfe < iVar32;
            iVar32 = iVar32 + -0xff) {
          *(char *)((long)plVar4 + -1) = -1;
          plVar4 = (long *)((long)plVar4 + 1);
        }
        *(char *)((long)plVar4 + -1) = (char)iVar32;
      }
      plVar18 = (long *)(uVar11 + (long)plVar4);
      do {
        *plVar4 = *plVar28;
        plVar4 = plVar4 + 1;
        plVar28 = plVar28 + 1;
        pcVar30 = local_70;
      } while (plVar4 < plVar18);
      do {
        *(short *)plVar18 = (short)plVar23 - (short)piVar29;
        puVar1 = (ulong *)((long)plVar23 + 4);
        puVar21 = (ulong *)(piVar29 + 1);
        puVar20 = puVar1;
        if (source + ((ulong)(uint)inputSize - 0xc) <= puVar1) {
LAB_001bcd08:
          iVar32 = ((int)puVar20 - (int)plVar23) + -4;
LAB_001bcd10:
          if (puVar20 < source + ((ulong)(uint)inputSize - 0xc)) {
            if (*puVar21 == *puVar20) goto code_r0x001bcd24;
            uVar25 = *puVar20 ^ *puVar21;
            uVar11 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar13 = ((uint)(uVar11 >> 3) & 0x1fffffff) + iVar32;
          }
          else {
            if ((puVar20 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar21 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar20 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar21 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar20 < source + ((ulong)(uint)inputSize - 5)) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar21 == (char)*puVar20));
            }
            uVar13 = (int)puVar20 - (int)puVar1;
          }
          goto LAB_001bcd49;
        }
        if (*puVar21 == *puVar1) {
          puVar21 = (ulong *)(piVar29 + 3);
          puVar20 = (ulong *)((long)plVar23 + 0xc);
          goto LAB_001bcd08;
        }
        uVar11 = *puVar1 ^ *puVar21;
        lVar22 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
          }
        }
        uVar13 = (uint)lVar22 >> 3;
LAB_001bcd49:
        if (pcVar8 < (char *)((long)plVar18 + (ulong)(uVar13 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        local_70 = (char *)((long)plVar18 + 2);
        if (uVar13 < 0xf) {
          *pcVar30 = *pcVar30 + (char)uVar13;
        }
        else {
          *pcVar30 = *pcVar30 + '\x0f';
          local_70[0] = -1;
          local_70[1] = -1;
          local_70[2] = -1;
          local_70[3] = -1;
          lVar22 = 0;
          for (uVar9 = uVar13 - 0xf; 0x3fb < uVar9; uVar9 = uVar9 - 0x3fc) {
            pcVar30 = (char *)((long)plVar18 + lVar22 + 6);
            pcVar30[0] = -1;
            pcVar30[1] = -1;
            pcVar30[2] = -1;
            pcVar30[3] = -1;
            lVar22 = lVar22 + 4;
          }
          lVar6 = lVar22 + ((ulong)uVar9 & 0xffff) / 0xff;
          local_70 = (char *)((long)plVar18 + lVar6 + 3);
          *(char *)((long)plVar18 + lVar6 + 2) =
               (char)lVar22 + (char)((uVar9 & 0xffff) / 0xff) + (char)uVar13 + -0xf;
        }
        lVar22 = (long)plVar23 + (ulong)uVar13;
        plVar28 = (long *)(lVar22 + 4);
        if (source + ((ulong)(uint)inputSize - 0xb) <= plVar28) {
LAB_001bd219:
          pcVar30 = source + ((ulong)(uint)inputSize - (long)plVar28);
          if (pcVar8 < local_70 + (long)(pcVar30 + (ulong)(pcVar30 + 0xf0) / 0xff + 1)) {
            return 0;
          }
          if (pcVar30 < (char *)0xf) {
            *local_70 = (char)pcVar30 << 4;
          }
          else {
            *local_70 = -0x10;
            for (pcVar8 = pcVar30 + -0xf; local_70 = local_70 + 1, (char *)0xfe < pcVar8;
                pcVar8 = pcVar8 + -0xff) {
              *local_70 = -1;
            }
            *local_70 = (char)pcVar8;
          }
          memcpy(local_70 + 1,plVar28,(size_t)pcVar30);
          return ((int)(local_70 + 1) + (int)pcVar30) - iVar16;
        }
        *(int *)((long)state + ((ulong)(*(long *)(lVar22 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar22 + 2) - iVar14;
        uVar11 = (ulong)(*plVar28 * -0x30e4432345000000) >> 0x34;
        uVar9 = (int)plVar28 - iVar14;
        uVar13 = *(uint *)((long)state + uVar11 * 4);
        piVar29 = (int *)((ulong)uVar13 + lVar24);
        *(uint *)((long)state + uVar11 * 4) = uVar9;
        if ((uVar13 + 0xffff < uVar9) || (*piVar29 != *(int *)plVar28)) goto LAB_001bcb57;
        plVar18 = (long *)(local_70 + 1);
        *local_70 = '\0';
        plVar23 = plVar28;
        pcVar30 = local_70;
      } while( true );
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize != 0) {
        uVar13 = *(uint *)((long)state + 0x4000);
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4000) = uVar13 + inputSize;
        *(undefined4 *)((long)state + 0x4004) = 3;
        piVar29 = (int *)source;
        if (0xc < (uint)inputSize) {
          lVar24 = (long)source - (ulong)uVar13;
          *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar13;
LAB_001bd679:
          uVar11 = 1;
          iVar32 = *(int *)((long)piVar29 + 1);
          piVar10 = (int *)((long)piVar29 + 1);
          uVar13 = acceleration << 6;
          do {
            piVar12 = piVar10;
            piVar10 = (int *)(uVar11 + (long)piVar12);
            if (source + ((ulong)(uint)inputSize - 0xb) < piVar10) goto LAB_001bd904;
            uVar11 = (ulong)(uVar13 >> 6);
            uVar13 = uVar13 + 1;
            uVar17 = (ulong)((uint)(iVar32 * -0x61c8864f) >> 0x13);
            uVar25 = (ulong)*(ushort *)((long)state + uVar17 * 2);
            sVar2 = (short)lVar24;
            iVar32 = *piVar10;
            *(short *)((long)state + uVar17 * 2) = (short)piVar12 - sVar2;
          } while (*(int *)(lVar24 + uVar25) != *piVar12);
          lVar6 = uVar25 + lVar24;
          iVar32 = (int)piVar29;
          lVar22 = 0;
          cVar3 = (char)piVar12 * '\x10' + (char)piVar29 * -0x10;
          do {
            cVar31 = cVar3;
            lVar15 = lVar22;
            pcVar8 = (char *)(lVar6 + lVar15);
            piVar10 = (int *)((long)piVar12 + lVar15);
            if ((pcVar8 <= source) || (piVar10 <= piVar29)) break;
            lVar22 = lVar15 + -1;
            cVar3 = cVar31 + -0x10;
          } while (*(char *)((long)piVar12 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
          if ((uint)(((int)piVar12 - iVar32) + (int)lVar15) < 0xf) {
            psVar7 = (short *)((long)dest + 1);
            *dest = cVar31;
          }
          else {
            *dest = -0x10;
            psVar7 = (short *)((long)dest + 2);
            for (iVar14 = ((int)piVar12 - iVar32) + (int)lVar15 + -0xf; 0xfe < iVar14;
                iVar14 = iVar14 + -0xff) {
              *(char *)((long)psVar7 + -1) = -1;
              psVar7 = (short *)((long)psVar7 + 1);
            }
            *(char *)((long)psVar7 + -1) = (char)iVar14;
          }
          psVar26 = (short *)((ulong)(uint)((int)piVar10 - iVar32) + (long)psVar7);
          do {
            *(undefined8 *)psVar7 = *(undefined8 *)piVar29;
            psVar7 = psVar7 + 4;
            piVar29 = piVar29 + 2;
            psVar27 = (short *)dest;
          } while (psVar7 < psVar26);
          do {
            *psVar26 = (short)piVar10 - (short)pcVar8;
            dest = (char *)(psVar26 + 1);
            puVar1 = (ulong *)(piVar10 + 1);
            puVar21 = (ulong *)(pcVar8 + 4);
            puVar20 = puVar1;
            if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
              if (*puVar21 == *puVar1) {
                puVar21 = (ulong *)(pcVar8 + 0xc);
                puVar20 = (ulong *)(piVar10 + 3);
                goto LAB_001bd7f2;
              }
              uVar25 = *puVar1 ^ *puVar21;
              uVar11 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar11 = uVar11 >> 3 & 0x1fffffff;
              piVar29 = (int *)((long)piVar10 + uVar11 + 4);
LAB_001bd86a:
              *(char *)psVar27 = (char)*psVar27 + (char)uVar11;
              piVar10 = piVar29;
            }
            else {
LAB_001bd7f2:
              if (puVar20 < source + ((ulong)(uint)inputSize - 0xc)) {
                if (*puVar21 == *puVar20) goto code_r0x001bd802;
                uVar25 = *puVar20 ^ *puVar21;
                uVar11 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                  }
                }
                puVar20 = (ulong *)((long)puVar20 + (uVar11 >> 3 & 0x1fffffff));
              }
              else {
                if ((puVar20 < source + ((ulong)(uint)inputSize - 8)) &&
                   ((int)*puVar21 == (int)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 4);
                  puVar21 = (ulong *)((long)puVar21 + 4);
                }
                if ((puVar20 < source + ((ulong)(uint)inputSize - 6)) &&
                   ((short)*puVar21 == (short)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 2);
                  puVar21 = (ulong *)((long)puVar21 + 2);
                }
                if (puVar20 < source + ((ulong)(uint)inputSize - 5)) {
                  puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar21 == (char)*puVar20));
                }
              }
              uVar11 = (long)puVar20 - (long)puVar1;
              piVar29 = (int *)((long)piVar10 + (uVar11 & 0xffffffff) + 4);
              if ((uint)uVar11 < 0xf) goto LAB_001bd86a;
              *(char *)psVar27 = (char)*psVar27 + '\x0f';
              *(short *)((long)dest + 0) = -1;
              *(short *)((long)dest + 2) = -1;
              lVar22 = 0;
              for (uVar13 = (uint)uVar11 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
                pcVar8 = (char *)((long)psVar26 + lVar22 + 6);
                pcVar8[0] = -1;
                pcVar8[1] = -1;
                pcVar8[2] = -1;
                pcVar8[3] = -1;
                lVar22 = lVar22 + 4;
              }
              lVar6 = lVar22 + (ulong)(uVar13 & 0xffff) / 0xff;
              dest = (char *)((long)psVar26 + lVar6 + 3);
              *(char *)((long)psVar26 + lVar6 + 2) =
                   (char)lVar22 +
                   (char)((ushort)uVar13 / 0xff) + ((char)puVar20 - (char)piVar10) + -0x13;
              piVar10 = piVar29;
            }
            piVar29 = piVar10;
            if (source + ((ulong)(uint)inputSize - 0xb) <= piVar10) break;
            *(short *)((long)state +
                      (ulong)((uint)(*(int *)((long)piVar10 + -2) * -0x61c8864f) >> 0x13) * 2) =
                 ((short)piVar10 + -2) - sVar2;
            uVar11 = (ulong)((uint)(*piVar10 * -0x61c8864f) >> 0x13);
            uVar25 = (ulong)*(ushort *)((long)state + uVar11 * 2);
            pcVar8 = (char *)(lVar24 + uVar25);
            *(short *)((long)state + uVar11 * 2) = (short)piVar10 - sVar2;
            if (*(int *)(lVar24 + uVar25) != *piVar10) goto LAB_001bd679;
            psVar26 = (short *)((long)dest + 1);
            *dest = '\0';
            psVar27 = (short *)dest;
          } while( true );
        }
LAB_001bd904:
        pcVar8 = source + ((ulong)(uint)inputSize - (long)piVar29);
        if (pcVar8 < (char *)0xf) {
          *dest = (char)pcVar8 << 4;
        }
        else {
          *dest = -0x10;
          for (pcVar30 = pcVar8 + -0xf; dest = (char *)((long)dest + 1), (char *)0xfe < pcVar30;
              pcVar30 = pcVar30 + -0xff) {
            *dest = -1;
          }
          *dest = (char)pcVar30;
        }
        memcpy((char *)((long)dest + 1),piVar29,(size_t)pcVar8);
        iVar32 = (int)(char *)((long)dest + 1) + (int)pcVar8;
        goto LAB_001bd94f;
      }
      goto LAB_001bd2b6;
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    uVar13 = *(uint *)((long)state + 0x4000);
    lVar24 = (long)source - (ulong)uVar13;
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
    *(uint *)((long)state + 0x4000) = inputSize + uVar13;
    *(undefined4 *)((long)state + 0x4004) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar13;
    plVar28 = (long *)source;
LAB_001bcf0a:
    lVar22 = *(long *)((long)plVar28 + 1);
    uVar11 = 1;
    plVar4 = (long *)((long)plVar28 + 1);
    uVar13 = acceleration << 6;
    while( true ) {
      plVar18 = (long *)(uVar11 + (long)plVar4);
      plVar23 = plVar28;
      pcVar8 = dest;
      if (source + ((ulong)(uint)inputSize - 0xb) < plVar18) goto LAB_001bd1d7;
      uVar11 = (ulong)(lVar22 * -0x30e4432345000000) >> 0x34;
      uVar9 = *(uint *)((long)state + uVar11 * 4);
      iVar32 = (int)plVar4;
      iVar14 = (int)lVar24;
      lVar22 = *plVar18;
      *(int *)((long)state + uVar11 * 4) = iVar32 - iVar14;
      if (((uint)(iVar32 - iVar14) <= uVar9 + 0xffff) &&
         (*(int *)(lVar24 + (ulong)uVar9) == (int)*plVar4)) break;
      uVar11 = (ulong)(uVar13 >> 6);
      uVar13 = uVar13 + 1;
      plVar4 = plVar18;
    }
    lVar6 = (ulong)uVar9 + lVar24;
    iVar19 = (int)plVar28;
    lVar22 = 0;
    cVar3 = (char)plVar4 * '\x10' + (char)plVar28 * -0x10;
    do {
      cVar31 = cVar3;
      lVar15 = lVar22;
      piVar29 = (int *)(lVar6 + lVar15);
      plVar23 = (long *)((long)plVar4 + lVar15);
      if ((piVar29 <= source) || (plVar23 <= plVar28)) break;
      lVar22 = lVar15 + -1;
      cVar3 = cVar31 + -0x10;
    } while (*(char *)((long)plVar4 + lVar15 + -1) == *(char *)(lVar6 + -1 + lVar15));
    if ((uint)((iVar32 - iVar19) + (int)lVar15) < 0xf) {
      plVar4 = (long *)(dest + 1);
      *dest = cVar31;
    }
    else {
      *dest = -0x10;
      plVar4 = (long *)(dest + 2);
      for (iVar32 = (iVar32 - iVar19) + (int)lVar15 + -0xf; 0xfe < iVar32; iVar32 = iVar32 + -0xff)
      {
        *(char *)((long)plVar4 + -1) = -1;
        plVar4 = (long *)((long)plVar4 + 1);
      }
      *(char *)((long)plVar4 + -1) = (char)iVar32;
    }
    plVar18 = (long *)((ulong)(uint)((int)plVar23 - iVar19) + (long)plVar4);
    do {
      *plVar4 = *plVar28;
      plVar4 = plVar4 + 1;
      plVar28 = plVar28 + 1;
    } while (plVar4 < plVar18);
    do {
      *(short *)plVar18 = (short)plVar23 - (short)piVar29;
      pcVar8 = (char *)((long)plVar18 + 2);
      puVar1 = (ulong *)((long)plVar23 + 4);
      puVar21 = (ulong *)(piVar29 + 1);
      puVar20 = puVar1;
      if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
        if (*puVar21 == *puVar1) {
          puVar21 = (ulong *)(piVar29 + 3);
          puVar20 = (ulong *)((long)plVar23 + 0xc);
          goto LAB_001bd0ac;
        }
        uVar25 = *puVar1 ^ *puVar21;
        uVar11 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        uVar11 = uVar11 >> 3 & 0x1fffffff;
        plVar28 = (long *)((long)plVar23 + uVar11 + 4);
LAB_001bd133:
        *dest = *dest + (char)uVar11;
        plVar23 = plVar28;
      }
      else {
LAB_001bd0ac:
        if (puVar20 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar21 == *puVar20) goto code_r0x001bd0c1;
          uVar25 = *puVar20 ^ *puVar21;
          uVar11 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          puVar20 = (ulong *)((long)puVar20 + (uVar11 >> 3 & 0x1fffffff));
        }
        else {
          if ((puVar20 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar21 == (int)*puVar20))
          {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar21 = (ulong *)((long)puVar21 + 4);
          }
          if ((puVar20 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar21 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar21 = (ulong *)((long)puVar21 + 2);
          }
          if (puVar20 < source + ((ulong)(uint)inputSize - 5)) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar21 == (char)*puVar20));
          }
        }
        uVar11 = (long)puVar20 - (long)puVar1;
        plVar28 = (long *)((long)plVar23 + (uVar11 & 0xffffffff) + 4);
        if ((uint)uVar11 < 0xf) goto LAB_001bd133;
        *dest = *dest + '\x0f';
        pcVar8[0] = -1;
        pcVar8[1] = -1;
        pcVar8[2] = -1;
        pcVar8[3] = -1;
        lVar22 = 0;
        for (uVar13 = (uint)uVar11 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
          pcVar8 = (char *)((long)plVar18 + lVar22 + 6);
          pcVar8[0] = -1;
          pcVar8[1] = -1;
          pcVar8[2] = -1;
          pcVar8[3] = -1;
          lVar22 = lVar22 + 4;
        }
        lVar6 = lVar22 + (ulong)(uVar13 & 0xffff) / 0xff;
        pcVar8 = (char *)((long)plVar18 + lVar6 + 3);
        *(char *)((long)plVar18 + lVar6 + 2) =
             (char)lVar22 + (char)((ushort)uVar13 / 0xff) + ((char)puVar20 - (char)plVar23) + -0x13;
        plVar23 = plVar28;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= plVar23) goto LAB_001bd1d7;
      *(int *)((long)state +
              ((ulong)(*(long *)((long)plVar23 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)plVar23 + -2) - iVar14;
      uVar11 = (ulong)(*plVar23 * -0x30e4432345000000) >> 0x34;
      uVar9 = (int)plVar23 - iVar14;
      uVar13 = *(uint *)((long)state + uVar11 * 4);
      piVar29 = (int *)((ulong)uVar13 + lVar24);
      *(uint *)((long)state + uVar11 * 4) = uVar9;
      plVar28 = plVar23;
      dest = pcVar8;
      if ((uVar13 + 0xffff < uVar9) || (*piVar29 != (int)*plVar23)) goto LAB_001bcf0a;
      plVar18 = (long *)(pcVar8 + 1);
      *pcVar8 = '\0';
    } while( true );
  }
  return 0;
code_r0x001bd0c1:
  puVar21 = puVar21 + 1;
  puVar20 = puVar20 + 1;
  goto LAB_001bd0ac;
code_r0x001bd802:
  puVar21 = puVar21 + 1;
  puVar20 = puVar20 + 1;
  goto LAB_001bd7f2;
code_r0x001bd4ee:
  puVar20 = puVar20 + 1;
  puVar21 = puVar21 + 1;
  iVar32 = iVar32 + 8;
  goto LAB_001bd4da;
code_r0x001bcd24:
  puVar20 = puVar20 + 1;
  puVar21 = puVar21 + 1;
  iVar32 = iVar32 + 8;
  goto LAB_001bcd10;
LAB_001bd1d7:
  pcVar30 = source + ((ulong)(uint)inputSize - (long)plVar23);
  if (pcVar30 < (char *)0xf) {
    *pcVar8 = (char)pcVar30 << 4;
  }
  else {
    *pcVar8 = -0x10;
    for (pcVar5 = pcVar30 + -0xf; pcVar8 = pcVar8 + 1, (char *)0xfe < pcVar5;
        pcVar5 = pcVar5 + -0xff) {
      *pcVar8 = -1;
    }
    *pcVar8 = (char)pcVar5;
  }
  memcpy(pcVar8 + 1,plVar23,(size_t)pcVar30);
  iVar32 = (int)(pcVar8 + 1) + (int)pcVar30;
LAB_001bd94f:
  return iVar32 - iVar16;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}